

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall skiwi::anon_unknown_23::cond::~cond(cond *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      TEST_EQ("2", run("(cond[1 2][else 3]) "));
      TEST_EQ("1", run("(cond[1][else 13]) "));
      TEST_EQ("#f", run("(cond[#f #t][#t #f]) "));
      TEST_EQ("17", run("(cond[else 17]) "));
      TEST_EQ("13", run("(cond[#f][#f 12][12 13]) "));
      TEST_EQ("1287", run("(let([b #t])(cond [else 1287])) "));
      TEST_EQ("2", run("(cond[(cons 1 2) => (lambda(x) (cdr x))]) "));

      TEST_EQ("yes", run("(if (> 3 2) 'yes 'no)"));
      TEST_EQ("no", run("(if (> 2 3) 'yes 'no)"));
      TEST_EQ("1", run("(if (> 3 2) (- 3 2)(+ 3 2))"));
      TEST_EQ("greater", run("(cond [(> 3 2) 'greater] [(< 3 2) 'less])"));
      TEST_EQ("less", run("(cond [(> 2 3) 'greater] [(< 2 3) 'less])"));
      TEST_EQ("equal", run("(cond [(> 3 3) 'greater] [(< 3 3) 'less] [else 'equal])"));
      }